

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  cmMakefile *pcVar1;
  size_type sVar2;
  cmGeneratorTarget *pcVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  undefined7 extraout_var;
  undefined7 uVar16;
  undefined8 extraout_RAX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  LinkClosure *pLVar13;
  long *plVar14;
  char *pcVar15;
  ulong *puVar17;
  size_type *psVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  pointer pbVar20;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar21;
  string d;
  string rootPath;
  string suffix;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string local_128;
  string local_108;
  string local_e8;
  allocator local_c4;
  allocator local_c3;
  allocator local_c2;
  allocator local_c1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [32];
  _Base_ptr local_90;
  size_t local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  char *local_78;
  string local_70;
  string local_50;
  
  pcVar1 = this->Makefile;
  pcVar4 = local_b0 + 0x10;
  local_c0 = runtimeDirs;
  local_b0._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"CMAKE_SKIP_RPATH","");
  bVar5 = cmMakefile::IsOn(pcVar1,(string *)local_b0);
  sVar2 = (this->RuntimeFlag)._M_string_length;
  if ((pointer)local_b0._0_8_ != pcVar4) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  bVar6 = true;
  if (!for_install) {
    pcVar3 = this->Target;
    local_b0._0_8_ = pcVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"BUILD_WITH_INSTALL_RPATH","");
    bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,(string *)local_b0);
    if ((pointer)local_b0._0_8_ != pcVar4) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
  }
  if (bVar5 || sVar2 == 0) {
    local_b0._24_8_ = local_b0 + 8;
    local_b0._8_4_ = _S_red;
    local_b0._16_8_ = 0;
    local_88 = 0;
    local_90 = (_Base_ptr)local_b0._24_8_;
    goto LAB_003b14da;
  }
  bVar5 = cmGeneratorTarget::HaveInstallTreeRPATH(this->Target);
  bVar7 = cmGeneratorTarget::HaveBuildTreeRPATH(this->Target,&this->Config);
  bVar8 = bVar7 & (bVar6 ^ 1U);
  if ((bVar6 ^ 1U) == 0) {
    pcVar1 = this->Makefile;
    local_b0._0_8_ = pcVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"CMAKE_SKIP_INSTALL_RPATH","");
    bVar7 = cmMakefile::IsOn(pcVar1,(string *)local_b0);
    if (bVar7) {
      local_b8 = 0;
    }
    else {
      pcVar3 = this->Target;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"INSTALL_RPATH_USE_LINK_PATH","");
      bVar7 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_108);
      local_b8 = CONCAT71(extraout_var,bVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
    }
    if ((pointer)local_b0._0_8_ != pcVar4) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    local_b0._24_8_ = local_b0 + 8;
    local_b0._8_4_ = _S_red;
    local_b0._16_8_ = 0;
    local_88 = 0;
    uVar16 = (undefined7)((ulong)local_b0._24_8_ >> 8);
    local_90 = (_Base_ptr)local_b0._24_8_;
    if ((bVar6 & bVar5) != 0) {
      pcVar3 = this->Target;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"INSTALL_RPATH","");
      pcVar15 = cmGeneratorTarget::GetProperty(pcVar3,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      cmCLI_ExpandListUnique
                (pcVar15,local_c0,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b0);
      uVar16 = (undefined7)((ulong)extraout_RAX >> 8);
    }
    if (bVar8 != 0) goto LAB_003b0dca;
    bVar5 = (char)local_b8 == '\0';
    local_b8 = CONCAT71(uVar16,1);
    if (bVar5) goto LAB_003b14da;
  }
  else {
    local_b0._24_8_ = local_b0 + 8;
    local_b0._8_4_ = _S_red;
    local_b0._16_8_ = 0;
    local_b8 = 0;
    local_88 = 0;
    local_90 = (_Base_ptr)local_b0._24_8_;
    if (bVar8 == 0) goto LAB_003b14da;
LAB_003b0dca:
    pcVar3 = this->Target;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"BUILD_RPATH","");
    pcVar15 = cmGeneratorTarget::GetProperty(pcVar3,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (pcVar15 != (char *)0x0) {
      cmCLI_ExpandListUnique
                (pcVar15,local_c0,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b0);
    }
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_allocated_capacity =
       local_108.field_2._M_allocated_capacity & 0xffffffffffffff00;
  pcVar1 = this->Makefile;
  paVar19 = &local_128.field_2;
  local_128._M_dataplus._M_p = (pointer)paVar19;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"CMAKE_SYSROOT_LINK","");
  pcVar15 = cmMakefile::GetDefinition(pcVar1,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar19) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  sVar2 = local_108._M_string_length;
  if (pcVar15 == (char *)0x0) {
    pcVar1 = this->Makefile;
    local_128._M_dataplus._M_p = (pointer)paVar19;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"CMAKE_SYSROOT","");
    pcVar15 = cmMakefile::GetSafeDefinition(pcVar1,&local_128);
    sVar2 = local_108._M_string_length;
    strlen(pcVar15);
    std::__cxx11::string::_M_replace((ulong)&local_108,0,(char *)sVar2,(ulong)pcVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    strlen(pcVar15);
    std::__cxx11::string::_M_replace((ulong)&local_108,0,(char *)sVar2,(ulong)pcVar15);
  }
  paVar19 = &local_128.field_2;
  pcVar1 = this->Makefile;
  local_128._M_dataplus._M_p = (pointer)paVar19;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"CMAKE_STAGING_PREFIX","");
  pcVar15 = cmMakefile::GetDefinition(pcVar1,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar19) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = this->Makefile;
  local_128._M_dataplus._M_p = (pointer)paVar19;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"CMAKE_INSTALL_PREFIX","");
  local_78 = cmMakefile::GetSafeDefinition(pcVar1,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar19) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::ConvertToUnixSlashes(&local_108);
  pvVar9 = cmOrderDirectories::GetOrderedDirectories_abi_cxx11_(this->OrderRuntimeSearchPath);
  pbVar20 = (pvVar9->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar20 !=
      (pvVar9->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_80 = pvVar9;
    do {
      if (bVar8 == 0) {
        if ((char)local_b8 != '\0') {
          pcVar11 = cmake::GetHomeDirectory(this->CMakeInstance);
          pcVar12 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
          std::__cxx11::string::string((string *)&local_128,pcVar11,&local_c1);
          bVar5 = cmsys::SystemTools::ComparePath(pbVar20,&local_128);
          if (bVar5) {
            bVar5 = false;
          }
          else {
            std::__cxx11::string::string((string *)&local_e8,pcVar12,&local_c2);
            bVar5 = cmsys::SystemTools::ComparePath(pbVar20,&local_e8);
            if (bVar5) {
              bVar5 = false;
            }
            else {
              std::__cxx11::string::string((string *)&local_50,pcVar11,&local_c3);
              bVar5 = cmsys::SystemTools::IsSubDirectory(pbVar20,&local_50);
              if (bVar5) {
                bVar5 = false;
              }
              else {
                std::__cxx11::string::string((string *)&local_70,pcVar12,&local_c4);
                bVar5 = cmsys::SystemTools::IsSubDirectory(pbVar20,&local_70);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p,
                                  local_70.field_2._M_allocated_capacity + 1);
                }
                bVar5 = !bVar5;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          pvVar9 = local_80;
          if (bVar5) {
            pcVar4 = (pbVar20->_M_dataplus)._M_p;
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_128,pcVar4,pcVar4 + pbVar20->_M_string_length);
            if (((char *)local_108._M_string_length == (char *)0x0) ||
               (lVar10 = std::__cxx11::string::find
                                   ((char *)&local_128,(ulong)local_108._M_dataplus._M_p,0),
               lVar10 != 0)) {
              if ((pcVar15 != (char *)0x0) && (*pcVar15 != '\0')) {
                strlen(pcVar15);
                lVar10 = std::__cxx11::string::find((char *)&local_128,(ulong)pcVar15,0);
                if (lVar10 == 0) {
                  strlen(pcVar15);
                  std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_128);
                  pcVar11 = local_78;
                  sVar2 = local_128._M_string_length;
                  strlen(local_78);
                  std::__cxx11::string::_M_replace((ulong)&local_128,0,(char *)sVar2,(ulong)pcVar11)
                  ;
                  std::__cxx11::string::append((char *)&local_128);
                  std::__cxx11::string::_M_append
                            ((char *)&local_128,(ulong)local_e8._M_dataplus._M_p);
                  cmsys::SystemTools::ConvertToUnixSlashes(&local_128);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) goto LAB_003b1486;
                }
              }
            }
            else {
              std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_128);
              std::__cxx11::string::operator=((string *)&local_128,(string *)&local_e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
LAB_003b1486:
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
            }
            pVar21 = std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::_M_insert_unique<std::__cxx11::string_const&>
                               ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)local_b0,&local_128);
            if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_c0,&local_128);
            }
            goto LAB_003b1232;
          }
        }
      }
      else {
        pcVar4 = (pbVar20->_M_dataplus)._M_p;
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,pcVar4,pcVar4 + pbVar20->_M_string_length);
        if (((char *)local_108._M_string_length == (char *)0x0) ||
           (lVar10 = std::__cxx11::string::find
                               ((char *)&local_128,(ulong)local_108._M_dataplus._M_p,0), lVar10 != 0
           )) {
          if ((pcVar15 != (char *)0x0) && (*pcVar15 != '\0')) {
            strlen(pcVar15);
            lVar10 = std::__cxx11::string::find((char *)&local_128,(ulong)pcVar15,0);
            if (lVar10 == 0) {
              strlen(pcVar15);
              std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_128);
              pcVar11 = local_78;
              sVar2 = local_128._M_string_length;
              strlen(local_78);
              std::__cxx11::string::_M_replace((ulong)&local_128,0,(char *)sVar2,(ulong)pcVar11);
              std::__cxx11::string::append((char *)&local_128);
              std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_e8._M_dataplus._M_p);
              cmsys::SystemTools::ConvertToUnixSlashes(&local_128);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) goto LAB_003b1203;
            }
          }
        }
        else {
          std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_128);
          std::__cxx11::string::operator=((string *)&local_128,(string *)&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
LAB_003b1203:
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
        }
        pVar21 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)local_b0,&local_128);
        if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_c0,&local_128);
        }
LAB_003b1232:
        pvVar9 = local_80;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          pvVar9 = local_80;
        }
      }
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 !=
             (pvVar9->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
LAB_003b14da:
  pLVar13 = cmGeneratorTarget::GetLinkClosure(this->Target,&this->Config);
  pbVar20 = (pLVar13->Languages).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar20 !=
      (pLVar13->Languages).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar19 = &local_128.field_2;
    do {
      std::operator+(&local_128,"CMAKE_",pbVar20);
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_128);
      puVar17 = (ulong *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_108.field_2._M_allocated_capacity = *puVar17;
        local_108.field_2._8_8_ = plVar14[3];
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      }
      else {
        local_108.field_2._M_allocated_capacity = *puVar17;
        local_108._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_108._M_string_length = plVar14[1];
      *plVar14 = (long)puVar17;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar19) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      bVar5 = cmMakefile::IsOn(this->Makefile,&local_108);
      if (bVar5) {
        std::operator+(&local_e8,"CMAKE_",pbVar20);
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_e8);
        psVar18 = (size_type *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_128.field_2._M_allocated_capacity = *psVar18;
          local_128.field_2._8_8_ = plVar14[3];
          local_128._M_dataplus._M_p = (pointer)paVar19;
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar18;
          local_128._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_128._M_string_length = plVar14[1];
        *plVar14 = (long)psVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        pcVar15 = cmMakefile::GetDefinition(this->Makefile,&local_128);
        if (pcVar15 != (char *)0x0) {
          cmCLI_ExpandListUnique
                    (pcVar15,local_c0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_b0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar19) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 !=
             (pLVar13->Languages).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmCLI_ExpandListUnique
            ((this->RuntimeAlways)._M_dataplus._M_p,local_c0,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b0);
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install)
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH() &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath = outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Construct the RPATH.
  std::set<std::string> emitted;
  if (use_install_rpath) {
    const char* install_rpath = this->Target->GetProperty("INSTALL_RPATH");
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
  }
  if (use_build_rpath) {
    // Add directories explicitly specified by user
    if (const char* build_rpath = this->Target->GetProperty("BUILD_RPATH")) {
      cmCLI_ExpandListUnique(build_rpath, runtimeDirs, emitted);
    }
  }
  if (use_build_rpath || use_link_rpath) {
    std::string rootPath;
    if (const char* sysrootLink =
          this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
      rootPath = sysrootLink;
    } else {
      rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    }
    const char* stagePath =
      this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    const char* installPrefix =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    for (std::vector<std::string>::const_iterator ri = rdirs.begin();
         ri != rdirs.end(); ++ri) {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if (use_build_rpath) {
        std::string d = *ri;
        if (!rootPath.empty() && d.find(rootPath) == 0) {
          d = d.substr(rootPath.size());
        } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
          std::string suffix = d.substr(strlen(stagePath));
          d = installPrefix;
          d += "/";
          d += suffix;
          cmSystemTools::ConvertToUnixSlashes(d);
        }
        if (emitted.insert(d).second) {
          runtimeDirs.push_back(d);
        }
      } else if (use_link_rpath) {
        // Do not add any path inside the source or build tree.
        const char* topSourceDir = this->CMakeInstance->GetHomeDirectory();
        const char* topBinaryDir =
          this->CMakeInstance->GetHomeOutputDirectory();
        if (!cmSystemTools::ComparePath(*ri, topSourceDir) &&
            !cmSystemTools::ComparePath(*ri, topBinaryDir) &&
            !cmSystemTools::IsSubDirectory(*ri, topSourceDir) &&
            !cmSystemTools::IsSubDirectory(*ri, topBinaryDir)) {
          std::string d = *ri;
          if (!rootPath.empty() && d.find(rootPath) == 0) {
            d = d.substr(rootPath.size());
          } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
            std::string suffix = d.substr(strlen(stagePath));
            d = installPrefix;
            d += "/";
            d += suffix;
            cmSystemTools::ConvertToUnixSlashes(d);
          }
          if (emitted.insert(d).second) {
            runtimeDirs.push_back(d);
          }
        }
      }
    }
  }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
    cmGeneratorTarget::LinkClosure const* lc =
      this->Target->GetLinkClosure(this->Config);
    for (std::vector<std::string>::const_iterator li = lc->Languages.begin();
         li != lc->Languages.end(); ++li) {
      std::string useVar =
        "CMAKE_" + *li + "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH";
      if (this->Makefile->IsOn(useVar)) {
        std::string dirVar = "CMAKE_" + *li + "_IMPLICIT_LINK_DIRECTORIES";
        if (const char* dirs = this->Makefile->GetDefinition(dirVar)) {
          cmCLI_ExpandListUnique(dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways.c_str(), runtimeDirs, emitted);
}